

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeBranchImmInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  int32_t iVar4;
  DecodeStatus In;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint imm;
  uint pred;
  DecodeStatus S;
  undefined8 in_stack_ffffffffffffffc0;
  uint Val;
  undefined4 in_stack_ffffffffffffffc8;
  DecodeStatus local_2c [6];
  uint32_t local_14;
  MCInst *local_10;
  DecodeStatus local_4;
  
  Val = (uint)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  local_2c[0] = MCDisassembler_Success;
  local_14 = in_ESI;
  local_10 = in_RDI;
  uVar2 = fieldFromInstruction_4(in_ESI,0x1c,4);
  uVar3 = fieldFromInstruction_4(local_14,0,0x18);
  uVar3 = uVar3 << 2;
  if (uVar2 == 0xf) {
    MCInst_setOpcode(local_10,0x3d);
    uVar2 = fieldFromInstruction_4(local_14,0x18,1);
    iVar4 = SignExtend32(uVar2 << 1 | uVar3,0x1a);
    MCOperand_CreateImm0(local_10,(long)iVar4);
    local_4 = local_2c[0];
  }
  else {
    iVar4 = SignExtend32(uVar3,0x1a);
    MCOperand_CreateImm0(local_10,(long)iVar4);
    In = DecodePredicateOperand
                   ((MCInst *)CONCAT44(uVar3,in_stack_ffffffffffffffc8),Val,(uint64_t)local_10,
                    (void *)0x27ceda);
    _Var1 = Check(local_2c,In);
    if (_Var1) {
      local_4 = local_2c[0];
    }
    else {
      local_4 = MCDisassembler_Fail;
    }
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeBranchImmInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 24) << 2;

	if (pred == 0xF) {
		MCInst_setOpcode(Inst, ARM_BLXi);
		imm |= fieldFromInstruction_4(Insn, 24, 1) << 1;
		MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
		return S;
	}

	MCOperand_CreateImm0(Inst, SignExtend32(imm, 26));
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}